

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O3

Object * __thiscall Assimp::FBX::Connection::DestinationObject(Connection *this)

{
  ulong uVar1;
  _Rb_tree_header *p_Var2;
  Object *pOVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  
  p_Var5 = (this->doc->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    uVar1 = this->dest;
    p_Var2 = &(this->doc->objects)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var2->_M_header;
    do {
      if (*(ulong *)(p_Var5 + 1) >= uVar1) {
        p_Var4 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar1];
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var4 != p_Var2) && (*(ulong *)(p_Var4 + 1) <= uVar1)) &&
       ((LazyObject *)p_Var4[1]._M_parent != (LazyObject *)0x0)) {
      pOVar3 = LazyObject::Get((LazyObject *)p_Var4[1]._M_parent,false);
      return pOVar3;
    }
  }
  __assert_fail("lazy",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.cpp"
                ,0x2c7,"const Object *Assimp::FBX::Connection::DestinationObject() const");
}

Assistant:

const Object* Connection::DestinationObject() const
{
    LazyObject* const lazy = doc.GetObject(dest);
    ai_assert(lazy);
    return lazy->Get();
}